

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::PortalImageInfiniteLight::Le
          (PortalImageInfiniteLight *this,Ray *ray,SampledWavelengths *lambda)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar9 [64];
  Bounds2f BVar11;
  SampledSpectrum SVar12;
  Point2f st;
  Tuple2<pbrt::Point2,_float> local_30;
  Tuple3<pbrt::Vector3,_float> local_28;
  undefined1 extraout_var [56];
  undefined1 auVar8 [56];
  undefined1 auVar10 [56];
  
  fVar1 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar4 = ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.x);
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),auVar4,auVar4);
  auVar5 = ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.z);
  auVar4 = vfmadd213ss_fma(auVar5,auVar5,auVar4);
  if (auVar4._0_4_ < 0.0) {
    local_28.z = sqrtf(auVar4._0_4_);
  }
  else {
    auVar4 = vsqrtss_avx(auVar4,auVar4);
    local_28.z = auVar4._0_4_;
  }
  uVar2 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar3 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar4._4_4_ = uVar3;
  auVar4._0_4_ = uVar2;
  auVar4._8_8_ = 0;
  auVar5._4_4_ = local_28.z;
  auVar5._0_4_ = local_28.z;
  auVar5._8_4_ = local_28.z;
  auVar5._12_4_ = local_28.z;
  auVar4 = vdivps_avx(auVar4,auVar5);
  auVar10 = ZEXT856(auVar4._8_8_);
  local_28.z = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z / local_28.z;
  local_28._0_8_ = vmovlps_avx(auVar4);
  auVar6._0_8_ = ImageFromRender(this,(Vector3f *)&local_28,(Float *)0x0);
  auVar6._8_56_ = extraout_var;
  local_30 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar6._0_16_);
  auVar8 = extraout_var;
  BVar11 = ImageBounds(this,&ray->o);
  auVar9._0_8_ = BVar11.pMax.super_Tuple2<pbrt::Point2,_float>;
  auVar9._8_56_ = auVar10;
  auVar7._0_8_ = BVar11.pMin.super_Tuple2<pbrt::Point2,_float>;
  auVar7._8_56_ = auVar8;
  if ((BVar11.pMin.super_Tuple2<pbrt::Point2,_float>.x <= local_30.x) &&
     (local_30.x <= BVar11.pMax.super_Tuple2<pbrt::Point2,_float>.x)) {
    auVar4 = vmovshdup_avx(auVar7._0_16_);
    if (auVar4._0_4_ <= local_30.y) {
      auVar4 = vmovshdup_avx(auVar9._0_16_);
      if (auVar4._0_4_ < local_30.y) {
        return (SampledSpectrum)(array<float,_4>)ZEXT816(0);
      }
      SVar12 = ImageLookup(this,(Point2f *)&local_30,lambda);
      return (array<float,_4>)SVar12.values.values;
    }
  }
  return (array<float,_4>)(array<float,_4>)ZEXT816(0);
}

Assistant:

SampledSpectrum PortalImageInfiniteLight::Le(const Ray &ray,
                                             const SampledWavelengths &lambda) const {
    // Ignore world to light...
    Vector3f w = Normalize(ray.d);
    Point2f st = ImageFromRender(w);

    if (!Inside(st, ImageBounds(ray.o)))
        return SampledSpectrum(0.f);

    return ImageLookup(st, lambda);
}